

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Graph<std::pair<double,_double>_>::twoOptSwap
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          Graph<std::pair<double,_double>_> *this,vector<int,_std::allocator<int>_> *ord,int *i,
          int *k)

{
  const_reference pvVar1;
  size_type sVar2;
  undefined4 local_4c;
  undefined4 local_48;
  int c_2;
  int c_1;
  undefined4 local_38;
  int c;
  int *k_local;
  int *i_local;
  vector<int,_std::allocator<int>_> *ord_local;
  Graph<std::pair<double,_double>_> *this_local;
  vector<int,_std::allocator<int>_> *new_ord;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (local_38 = 0; local_38 < *i; local_38 = local_38 + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(ord,(long)local_38);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar1);
  }
  for (local_48 = *k; *i <= local_48; local_48 = local_48 + -1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(ord,(long)local_48);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar1);
  }
  local_4c = *k;
  while( true ) {
    local_4c = local_4c + 1;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(ord);
    if (sVar2 <= (ulong)(long)local_4c) break;
    pvVar1 = std::vector<int,_std::allocator<int>_>::at(ord,(long)local_4c);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,pvVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> Graph<T>::twoOptSwap(const vector<int> &ord, const int &i, const int &k) {
    vector<int> new_ord;

    for (int c = 0; c < i; c++) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k; c >= i; c--) {
        new_ord.push_back(ord.at(c));
    }

    for (int c = k + 1; c < ord.size(); c++) {
        new_ord.push_back(ord.at(c));
    }

    return new_ord;
}